

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O0

int jpc_putms(jas_stream_t *out,jpc_cstate_t *cstate,jpc_ms_t *ms)

{
  int iVar1;
  jas_stream_t *stream;
  long lVar2;
  int len;
  jas_stream_t *tmpstream;
  jpc_ms_t *ms_local;
  jpc_cstate_t *cstate_local;
  jas_stream_t *out_local;
  
  iVar1 = jpc_putuint16(out,ms->id);
  if (iVar1 != 0) {
    return -1;
  }
  if (ms->ops->putparms != (_func_int_jpc_ms_t_ptr_jpc_cstate_t_ptr_jas_stream_t_ptr *)0x0) {
    stream = jas_stream_memopen((char *)0x0,0);
    if (stream == (jas_stream_t *)0x0) {
      return -1;
    }
    iVar1 = (*ms->ops->putparms)(ms,cstate,stream);
    if (iVar1 != 0) {
      jas_stream_close(stream);
      return -1;
    }
    lVar2 = jas_stream_tell(stream);
    if ((int)lVar2 < 0) {
      jas_stream_close(stream);
      return -1;
    }
    ms->len = (long)(int)lVar2;
    lVar2 = jas_stream_seek(stream,0,0);
    if (((lVar2 < 0) || (iVar1 = jpc_putuint16(out,ms->len + 2), iVar1 != 0)) ||
       (iVar1 = jas_stream_copy(out,stream,(int)ms->len), iVar1 < 0)) {
      jas_stream_close(stream);
      return -1;
    }
    jas_stream_close(stream);
  }
  if (ms->id == 0xff51) {
    cstate->numcomps = (ms->parms).siz.numcomps;
  }
  iVar1 = jas_getdbglevel();
  if (0 < iVar1) {
    jpc_ms_dump(ms,_stderr);
  }
  return 0;
}

Assistant:

int jpc_putms(jas_stream_t *out, jpc_cstate_t *cstate, jpc_ms_t *ms)
{
	jas_stream_t *tmpstream;
	int len;

	/* Output the marker segment type. */
	if (jpc_putuint16(out, ms->id)) {
		return -1;
	}

	/* Output the marker segment length and parameters if necessary. */
	if (ms->ops->putparms) {
		/* Create a temporary stream in which to buffer the
		  parameter data. */
		if (!(tmpstream = jas_stream_memopen(0, 0))) {
			return -1;
		}
		if ((*ms->ops->putparms)(ms, cstate, tmpstream)) {
			jas_stream_close(tmpstream);
			return -1;
		}
		/* Get the number of bytes of parameter data written. */
		if ((len = jas_stream_tell(tmpstream)) < 0) {
			jas_stream_close(tmpstream);
			return -1;
		}
		ms->len = len;
		/* Write the marker segment length and parameter data to
		  the output stream. */
		if (jas_stream_seek(tmpstream, 0, SEEK_SET) < 0 ||
		  jpc_putuint16(out, ms->len + 2) ||
		  jas_stream_copy(out, tmpstream, ms->len) < 0) {
			jas_stream_close(tmpstream);
			return -1;
		}
		/* Close the temporary stream. */
		jas_stream_close(tmpstream);
	}

	/* This is a bit of a hack, but I'm not going to define another
	  type of virtual function for this one special case. */
	if (ms->id == JPC_MS_SIZ) {
		cstate->numcomps = ms->parms.siz.numcomps;
	}

	if (jas_getdbglevel() > 0) {
		jpc_ms_dump(ms, stderr);
	}

	return 0;
}